

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O1

void glad_debug_impl_glVertexAttrib3f(GLuint arg0,GLfloat arg1,GLfloat arg2,GLfloat arg3)

{
  (*_pre_call_callback)("glVertexAttrib3f",glad_debug_glVertexAttrib3f,4,arg0);
  (*glad_glVertexAttrib3f)(arg0,arg1,arg2,arg3);
  (*_post_call_callback)
            ("glVertexAttrib3f",glad_debug_glVertexAttrib3f,4,(double)arg1,(double)arg2,(double)arg3
             ,arg0,_post_call_callback);
  return;
}

Assistant:

void APIENTRY glad_debug_impl_glVertexAttrib3f(GLuint arg0, GLfloat arg1, GLfloat arg2, GLfloat arg3) {    
    _pre_call_callback("glVertexAttrib3f", (void*)glVertexAttrib3f, 4, arg0, arg1, arg2, arg3);
     glad_glVertexAttrib3f(arg0, arg1, arg2, arg3);
    _post_call_callback("glVertexAttrib3f", (void*)glVertexAttrib3f, 4, arg0, arg1, arg2, arg3);
    
}